

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall Model::SetupModel(Model *this)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_int,_Texture>_> *in_RDI;
  Mesh *unaff_retaddr;
  pair<const_int,_Mesh> *meshe;
  iterator __end1_1;
  iterator __begin1_1;
  map<int,_Mesh,_std::less<int>,_std::allocator<std::pair<const_int,_Mesh>_>_> *__range1_1;
  pair<const_int,_Texture> *texture;
  iterator __end1;
  iterator __begin1;
  map<int,_Texture,_std::less<int>,_std::allocator<std::pair<const_int,_Texture>_>_> *__range1;
  map<int,_Mesh,_std::less<int>,_std::allocator<std::pair<const_int,_Mesh>_>_>
  *in_stack_ffffffffffffffa8;
  _Self local_40;
  _Self local_38;
  _Rb_tree_iterator<std::pair<const_int,_Texture>_> *local_30;
  reference local_28;
  _Self local_20;
  _Self local_18;
  _Rb_tree_iterator<std::pair<const_int,_Texture>_> *local_10;
  
  local_10 = in_RDI + 0x21;
  local_18._M_node =
       (_Base_ptr)
       std::map<int,_Texture,_std::less<int>,_std::allocator<std::pair<const_int,_Texture>_>_>::
       begin((map<int,_Texture,_std::less<int>,_std::allocator<std::pair<const_int,_Texture>_>_> *)
             in_stack_ffffffffffffffa8);
  local_20._M_node =
       (_Base_ptr)
       std::map<int,_Texture,_std::less<int>,_std::allocator<std::pair<const_int,_Texture>_>_>::end
                 ((map<int,_Texture,_std::less<int>,_std::allocator<std::pair<const_int,_Texture>_>_>
                   *)in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    local_28 = std::_Rb_tree_iterator<std::pair<const_int,_Texture>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_int,_Texture>_> *)0x15173b);
    Texture::SetupTexture((Texture *)unaff_retaddr);
    std::_Rb_tree_iterator<std::pair<const_int,_Texture>_>::operator++(in_RDI);
  }
  local_30 = in_RDI + 9;
  local_38._M_node =
       (_Base_ptr)
       std::map<int,_Mesh,_std::less<int>,_std::allocator<std::pair<const_int,_Mesh>_>_>::begin
                 (in_stack_ffffffffffffffa8);
  local_40._M_node =
       (_Base_ptr)
       std::map<int,_Mesh,_std::less<int>,_std::allocator<std::pair<const_int,_Mesh>_>_>::end
                 (in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<const_int,_Mesh>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_int,_Mesh>_> *)0x1517a5);
    Mesh::SetupMesh(unaff_retaddr);
    std::_Rb_tree_iterator<std::pair<const_int,_Mesh>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_Mesh>_> *)in_RDI);
  }
  return;
}

Assistant:

void Model::SetupModel() {
    for (auto & texture : textures)
        texture.second.SetupTexture();

    for (auto & meshe : meshes)
        meshe.second.SetupMesh();
}